

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void regenerateBuffer(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  pointer pfVar7;
  size_t sVar8;
  undefined8 in_RAX;
  value_type *pvVar9;
  size_t sVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  std::vector<float,_std::allocator<float>_>::resize(&shape_scalars,vertex_count);
  sVar8 = vertex_count;
  pfVar7 = shape_scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar6 = legendre_2_zz_scalar;
  fVar5 = legendre_2_scalar;
  fVar4 = legendre_1_scalar;
  if (vertex_count != 0) {
    fVar12 = -legendre_1_scalar;
    fVar11 = -legendre_2_scalar;
    fVar13 = legendre_2_scalar * 0.5;
    pvVar9 = &((sphere_positions.
                super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_0).field_0.z;
    sVar10 = 0;
    do {
      fVar1 = ((anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float>_1_0 *)
              (pvVar9 + -2))->x;
      fVar2 = pvVar9[-1];
      fVar3 = *pvVar9;
      pfVar7[sVar10] =
           (fVar1 * fVar1 - fVar2 * fVar2) * fVar13 * legendre_params[8] +
           fVar3 * fVar11 * fVar1 * legendre_params[7] +
           (fVar3 * 3.0 * fVar3 + -1.0) * fVar6 * legendre_params[6] +
           fVar2 * fVar11 * fVar3 * legendre_params[5] +
           fVar2 * fVar5 * fVar1 * legendre_params[4] +
           fVar1 * fVar12 * legendre_params[3] +
           fVar3 * fVar4 * legendre_params[2] +
           legendre_params[0] * 0.15915494 + fVar2 * fVar12 * legendre_params[1];
      sVar10 = sVar10 + 1;
      pvVar9 = pvVar9 + 3;
    } while (sVar8 != sVar10);
  }
  (*__glewBindBuffer)(0x8892,vertex_buffer);
  (*__glewBufferData)(0x8892,vertex_count << 2,
                      shape_scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,0x88e8,in_RAX);
  return;
}

Assistant:

void regenerateBuffer() {
    Perf stat("Regenerate legendre buffer");
    shape_scalars.resize(vertex_count);
    for (int n = 0; n < vertex_count; n++) {
        vec3 pos = sphere_positions[n];
        shape_scalars[n] = legendre_total(pos, legendre_params);
    }

    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, vertex_count * sizeof(float), shape_scalars.data(), GL_DYNAMIC_DRAW);
}